

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TParseContext::addAssign
          (TParseContext *this,TSourceLoc *loc,TOperator op,TIntermTyped *left,TIntermTyped *right)

{
  int iVar1;
  _func_int **pp_Var2;
  TIntermTyped *pTVar3;
  undefined **ppuVar4;
  char *pcVar5;
  
  if ((op & ~EOpSequence) == EOpAddAssign) {
    iVar1 = (*(left->type)._vptr_TType[7])(&left->type);
    if (iVar1 != 0x12) goto LAB_003a00ee;
    pp_Var2 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    ppuVar4 = &E_GL_EXT_buffer_reference2;
    pcVar5 = "+= and -= on a buffer reference";
  }
  else {
    if (op != EOpAssign) goto LAB_003a00ee;
    iVar1 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x20])(left);
    if (iVar1 != 0xe) goto LAB_003a00ee;
    iVar1 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])(right);
    if (iVar1 != 0xe) goto LAB_003a00ee;
    pp_Var2 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    ppuVar4 = &E_GL_ARB_bindless_texture;
    pcVar5 = "sampler assignment for bindless texture";
  }
  (*pp_Var2[5])(this,loc,1,ppuVar4,pcVar5);
LAB_003a00ee:
  pTVar3 = TIntermediate::addAssign
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,op,left,
                      right,loc);
  return pTVar3;
}

Assistant:

TIntermTyped* TParseContext::addAssign(const TSourceLoc& loc, TOperator op, TIntermTyped* left, TIntermTyped* right)
{
    if ((op == EOpAddAssign || op == EOpSubAssign) && left->isReference())
        requireExtensions(loc, 1, &E_GL_EXT_buffer_reference2, "+= and -= on a buffer reference");

    if (op == EOpAssign && left->getBasicType() == EbtSampler && right->getBasicType() == EbtSampler)
        requireExtensions(loc, 1, &E_GL_ARB_bindless_texture, "sampler assignment for bindless texture");

    return intermediate.addAssign(op, left, right, loc);
}